

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha512_Final(SHA512_CTX *context,sha2_byte *digest)

{
  uint64_t *data;
  undefined1 auVar1 [16];
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  int j;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  
  if (digest != (sha2_byte *)0x0) {
    uVar12 = (uint)context->bitcount[0] >> 3 & 0x7f;
    data = context->buffer;
    uVar10 = uVar12 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar12) = 0x80;
    if (0x6f < uVar12) {
      memzero((void *)((ulong)uVar10 + (long)data),(ulong)(uVar12 ^ 0x7f));
      for (lVar11 = 10; lVar11 != 0x1a; lVar11 = lVar11 + 1) {
        uVar2 = context->state[lVar11];
        context->state[lVar11] =
             uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      }
      sha512_Transform(context->state,data,context->state);
      uVar10 = 0;
    }
    memzero((void *)((ulong)uVar10 + (long)data),(ulong)(0x70 - uVar10));
    for (lVar11 = 10; lVar11 != 0x18; lVar11 = lVar11 + 1) {
      uVar2 = context->state[lVar11];
      context->state[lVar11] =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    auVar1 = *(undefined1 (*) [16])context->bitcount;
    auVar13._0_8_ = auVar1._8_8_;
    auVar13._8_4_ = auVar1._0_4_;
    auVar13._12_4_ = auVar1._4_4_;
    *(undefined1 (*) [16])(context->buffer + 0xe) = auVar13;
    sha512_Transform(context->state,data,context->state);
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      uVar2 = context->state[lVar11];
      context->state[lVar11] =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    uVar3 = context->state[0];
    uVar4 = context->state[1];
    uVar5 = context->state[2];
    uVar6 = context->state[3];
    uVar7 = context->state[4];
    uVar8 = context->state[5];
    uVar9 = context->state[7];
    *(uint64_t *)(digest + 0x30) = context->state[6];
    *(uint64_t *)(digest + 0x38) = uVar9;
    *(uint64_t *)(digest + 0x20) = uVar7;
    *(uint64_t *)(digest + 0x28) = uVar8;
    *(uint64_t *)(digest + 0x10) = uVar5;
    *(uint64_t *)(digest + 0x18) = uVar6;
    *(uint64_t *)digest = uVar3;
    *(uint64_t *)(digest + 8) = uVar4;
  }
  memzero(context,0xd0);
  return;
}

Assistant:

void sha512_Final(trezor::SHA512_CTX* context, sha2_byte digest[]) {
	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		sha512_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE64(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA512_DIGEST_LENGTH);
	}

	/* Zero out state data */
	memzero(context, sizeof(trezor::SHA512_CTX));
}